

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjAdd(jx9_value *pObj1,jx9_value *pObj2,int bAddStore)

{
  jx9_hashmap *pjVar1;
  jx9_hashmap_node *pjVar2;
  jx9_vm *pjVar3;
  sxi32 sVar4;
  int iVar5;
  ulong uVar6;
  jx9_hashmap *pDest;
  jx9_value *pjVar7;
  undefined4 in_register_00000014;
  jx9_hashmap_node **ppjVar8;
  uint uVar9;
  double dVar10;
  
  if (((pObj2->iFlags | pObj1->iFlags) & 0x40U) == 0) {
    jx9MemObjToNumeric(pObj1);
    jx9MemObjToNumeric(pObj2);
    uVar9 = pObj1->iFlags;
    if (((pObj2->iFlags | uVar9) & 4) == 0) {
      (pObj1->x).pOther = (void *)((long)(pObj1->x).pOther + (long)(pObj2->x).pOther);
      uVar6 = (ulong)(uVar9 & 0xfffffe90 | 2);
    }
    else {
      if ((uVar9 & 4) == 0) {
        jx9MemObjToReal(pObj1);
      }
      if ((pObj2->iFlags & 4) == 0) {
        jx9MemObjToReal(pObj2);
      }
      dVar10 = (pObj1->x).rVal + (pObj2->x).rVal;
      (pObj1->x).rVal = dVar10;
      uVar6 = (long)dVar10;
      if (9.223372036854776e+18 < ABS(dVar10)) {
        uVar6 = 0x8000000000000000;
      }
      pObj1->iFlags = pObj1->iFlags & 0xfffffe90U | 4;
      if (0xfffffffffffffffd < uVar6 + 0x7fffffffffffffff || dVar10 != (double)(long)uVar6)
      goto LAB_0011ff94;
      (pObj1->x).iVal = uVar6;
      uVar6 = 2;
    }
  }
  else {
    if (bAddStore == 0) {
      pDest = jx9NewHashmap(pObj1->pVm,(_func_sxu32_sxi64 *)pObj2,
                            (_func_sxu32_void_ptr_sxu32 *)CONCAT44(in_register_00000014,bAddStore));
      if (pDest == (jx9_hashmap *)0x0) {
LAB_0011fe3a:
        sVar4 = jx9VmThrowError(pObj1->pVm,(SyString *)0x0,1,
                                "JX9 is running out of memory while creating array");
        return sVar4;
      }
    }
    else {
      if ((pObj1->iFlags & 0x40U) == 0) {
        sVar4 = jx9MemObjToHashmap(pObj1);
        if (sVar4 != 0) goto LAB_0011fe3a;
      }
      pDest = (jx9_hashmap *)(pObj1->x).pOther;
    }
    if (bAddStore == 0) {
      if ((pObj1->iFlags & 0x40U) == 0) {
        if ((pObj1->iFlags & 0x20U) == 0) {
          HashmapInsert(pDest,(jx9_value *)0x0,pObj1);
        }
      }
      else {
        jx9HashmapDup((jx9_hashmap *)(pObj1->x).pOther,pDest);
      }
    }
    if ((pObj2->iFlags & 0x40U) == 0) {
      if ((pObj2->iFlags & 0x20U) == 0) {
        HashmapInsert(pDest,(jx9_value *)0x0,pObj2);
      }
    }
    else {
      pjVar1 = (jx9_hashmap *)(pObj2->x).iVal;
      if ((pDest != pjVar1) && (pjVar1->nEntry != 0)) {
        ppjVar8 = &pjVar1->pFirst;
        uVar9 = 0;
        do {
          pjVar2 = *ppjVar8;
          if (pjVar2->iType == 2) {
            sVar4 = HashmapLookupBlobKey
                              (pDest,(pjVar2->xKey).sKey.pBlob,(pjVar2->xKey).sKey.nByte,
                               (jx9_hashmap_node **)0x0);
            if (sVar4 != 0) {
              pjVar3 = pjVar2->pMap->pVm;
              if (pjVar2->nValIdx < (pjVar3->aMemObj).nUsed) {
                pjVar7 = (jx9_value *)
                         ((ulong)(pjVar2->nValIdx * (pjVar3->aMemObj).eSize) +
                         (long)(pjVar3->aMemObj).pBase);
              }
              else {
                pjVar7 = (jx9_value *)0x0;
              }
              if (pjVar7 != (jx9_value *)0x0) {
                iVar5 = HashmapInsertBlobKey
                                  (pDest,(pjVar2->xKey).sKey.pBlob,(pjVar2->xKey).sKey.nByte,pjVar7)
                ;
LAB_0011ff5f:
                if (iVar5 != 0) break;
              }
            }
          }
          else {
            sVar4 = HashmapLookupIntKey(pDest,(pjVar2->xKey).iKey,(jx9_hashmap_node **)0x0);
            if (sVar4 != 0) {
              pjVar3 = pjVar2->pMap->pVm;
              if (pjVar2->nValIdx < (pjVar3->aMemObj).nUsed) {
                pjVar7 = (jx9_value *)
                         ((ulong)(pjVar2->nValIdx * (pjVar3->aMemObj).eSize) +
                         (long)(pjVar3->aMemObj).pBase);
              }
              else {
                pjVar7 = (jx9_value *)0x0;
              }
              if (pjVar7 != (jx9_value *)0x0) {
                iVar5 = HashmapInsertIntKey(pDest,(pjVar2->xKey).iKey,pjVar7);
                goto LAB_0011ff5f;
              }
            }
          }
          ppjVar8 = &pjVar2->pPrev;
          uVar9 = uVar9 + 1;
        } while (uVar9 < pjVar1->nEntry);
      }
    }
    if ((pObj1->iFlags & 1) != 0) {
      SyBlobRelease(&pObj1->sBlob);
    }
    (pObj1->x).pOther = pDest;
    uVar6 = (ulong)(pObj1->iFlags & 0xfffffe90U | 0x40);
  }
  pObj1->iFlags = (sxi32)uVar6;
LAB_0011ff94:
  return (sxi32)uVar6;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjAdd(jx9_value *pObj1, jx9_value *pObj2, int bAddStore)
{
	if( ((pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP) == 0 ){
			/* Arithemtic operation */
			jx9MemObjToNumeric(pObj1);
			jx9MemObjToNumeric(pObj2);
			if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_REAL ){
				/* Floating point arithmetic */
				jx9_real a, b;
				if( (pObj1->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj1);
				}
				if( (pObj2->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj2);
				}
				a = pObj1->x.rVal;
				b = pObj2->x.rVal;
				pObj1->x.rVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_REAL);
				/* Try to get an integer representation also */
				MemObjTryIntger(&(*pObj1));
			}else{
				/* Integer arithmetic */
				sxi64 a, b;
				a = pObj1->x.iVal;
				b = pObj2->x.iVal;
				pObj1->x.iVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_INT);
			}
	}else{
		if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP ){
			jx9_hashmap *pMap;
			sxi32 rc;
			if( bAddStore ){
				/* Do not duplicate the hashmap, use the left one since its an add&store operation.
				 */
				if( (pObj1->iFlags & MEMOBJ_HASHMAP) == 0 ){				
					/* Force a hashmap cast */
					rc = jx9MemObjToHashmap(pObj1);
					if( rc != SXRET_OK ){
						jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
						return rc;
					}
				}
				/* Point to the structure that describe the hashmap */
				pMap = (jx9_hashmap *)pObj1->x.pOther;
			}else{
				/* Create a new hashmap */
				pMap = jx9NewHashmap(pObj1->pVm, 0, 0);
				if( pMap == 0){
					jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
					return SXERR_MEM;
				}
			}
			if( !bAddStore ){
				if(pObj1->iFlags & MEMOBJ_HASHMAP ){
					/* Perform a hashmap duplication */
					jx9HashmapDup((jx9_hashmap *)pObj1->x.pOther, pMap);
				}else{
					if((pObj1->iFlags & MEMOBJ_NULL) == 0 ){
						/* Simple insertion */
						jx9HashmapInsert(pMap, 0, pObj1);
					}
				}
			}
			/* Perform the union */
			if(pObj2->iFlags & MEMOBJ_HASHMAP ){
				jx9HashmapUnion(pMap, (jx9_hashmap *)pObj2->x.pOther);
			}else{
				if((pObj2->iFlags & MEMOBJ_NULL) == 0 ){
					/* Simple insertion */
					jx9HashmapInsert(pMap, 0, pObj2);
				}
			}
			/* Reflect the change */
			if( pObj1->iFlags & MEMOBJ_STRING ){
				SyBlobRelease(&pObj1->sBlob);
			}
			pObj1->x.pOther = pMap;
			MemObjSetType(pObj1, MEMOBJ_HASHMAP);
		}
	}
	return SXRET_OK;
}